

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O3

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
~ConcreteMachine(ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this)

{
  default_delete<Storage::Encodings::MFM::Parser> *this_00;
  Parser *__ptr;
  pointer puVar1;
  Flywheel *pFVar2;
  FIRFilter *__ptr_00;
  pointer psVar3;
  long lVar4;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0059e5c8;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0059e650;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0059e698;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0059e6b0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0059e6e0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0059e720;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0059e738;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0059e770;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0059e788;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&(this->speaker_).queue);
  lVar4 = 0;
  do {
    this_00 = (default_delete<Storage::Encodings::MFM::Parser> *)
              ((long)(this->pit_).channels_ + lVar4 + -0x4c);
    __ptr = *(Parser **)((long)(this->pit_).channels_ + lVar4 + -0x4c);
    if (__ptr != (Parser *)0x0) {
      std::default_delete<Storage::Encodings::MFM::Parser>::operator()(this_00,__ptr);
    }
    *(undefined8 *)this_00 = 0;
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x40);
  puVar1 = (this->fdc_).results_.result_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->fdc_).results_.result_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->fdc_).decoder_.command_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->fdc_).decoder_.command_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->keyboard_).input_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->keyboard_).input_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->video_).outputter_.font.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->video_).outputter_.font.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pFVar2 = (this->video_).outputter_.crt.vertical_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar2 != (Flywheel *)0x0) {
    operator_delete(pFVar2,0x24);
  }
  (this->video_).outputter_.crt.vertical_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  pFVar2 = (this->video_).outputter_.crt.horizontal_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar2 != (Flywheel *)0x0) {
    operator_delete(pFVar2,0x24);
  }
  (this->video_).outputter_.crt.horizontal_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  (this->speaker_).speaker.super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__LowpassBase_00593568;
  __ptr_00 = (this->speaker_).speaker.
             super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.filter_._M_t.
             super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
             .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl;
  if (__ptr_00 != (FIRFilter *)0x0) {
    std::default_delete<SignalProcessing::FIRFilter>::operator()
              ((default_delete<SignalProcessing::FIRFilter> *)
               &(this->speaker_).speaker.
                super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.filter_,
               __ptr_00);
  }
  (this->speaker_).speaker.super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.
  filter_._M_t.
  super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
  .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl = (FIRFilter *)0x0;
  psVar3 = (this->speaker_).speaker.
           super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.output_buffer_.
           super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (psVar3 != (pointer)0x0) {
    operator_delete(psVar3,(long)*(pointer *)
                                  ((long)&(this->speaker_).speaker.
                                          super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>
                                          .output_buffer_.
                                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)psVar3);
  }
  psVar3 = (this->speaker_).speaker.
           super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.input_buffer_.
           super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (psVar3 != (pointer)0x0) {
    operator_delete(psVar3,(long)*(pointer *)
                                  ((long)&(this->speaker_).speaker.
                                          super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>
                                          .input_buffer_.
                                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)psVar3);
  }
  (this->speaker_).speaker.super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__Speaker_0058ce68;
  psVar3 = (this->speaker_).speaker.
           super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>.super_Speaker.
           mix_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar3 != (pointer)0x0) {
    operator_delete(psVar3,(long)*(pointer *)
                                  ((long)&(this->speaker_).speaker.
                                          super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>
                                          .super_Speaker.mix_buffer_.
                                          super__Vector_base<short,_std::allocator<short>_>._M_impl
                                  + 0x10) - (long)psVar3);
  }
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&(this->speaker_).queue);
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_00599ae0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00599b10;
  Inputs::Keyboard::~Keyboard(&(this->super_MappedKeyboardMachine).keyboard_);
  return;
}

Assistant:

~ConcreteMachine() {
			speaker_.queue.flush();
		}